

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O3

bool duckdb::TryDecimalStringCast<long,(char)44>
               (char *string_ptr,idx_t string_size,long *result,uint8_t width,uint8_t scale)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  undefined7 uVar5;
  ulong uVar4;
  uint uVar6;
  undefined7 in_register_00000009;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  duckdb *pdVar11;
  uint8_t uVar12;
  ulong uVar13;
  byte bVar14;
  ulong uVar15;
  ulong uVar16;
  short local_5e;
  undefined4 local_5c;
  DecimalCastData<long> local_58;
  ulong local_40;
  ulong local_38;
  
  local_58.result = 0;
  local_58.digit_count = '\0';
  local_58.decimal_count = '\0';
  local_58.round_set = false;
  local_58.should_round = false;
  local_58.excessive_decimals = '\0';
  local_58.exponent_type = NONE;
  local_58.limit =
       *(StoreType_conflict1 *)
        (NumericHelper::POWERS_OF_TEN + (CONCAT71(in_register_00000009,width) & 0xffffffff) * 8);
  if (string_size == 0) {
    return false;
  }
  uVar9 = 0;
  while ((bVar1 = string_ptr[uVar9], bVar1 - 9 < 5 || (bVar1 == 0x20))) {
    uVar9 = uVar9 + 1;
    if (string_size == uVar9) {
      return false;
    }
  }
  local_58.width = width;
  local_58.scale = scale;
  if (bVar1 == 0x2d) {
    if (string_size - 1 == uVar9) {
      DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,true>(&local_58);
      return false;
    }
    uVar13 = string_size - uVar9;
    uVar7 = 1;
    local_58.digit_count = 0;
    local_58.result = 0;
    do {
      bVar1 = string_ptr[uVar9 + uVar7];
      bVar14 = bVar1 - 0x30;
      if (9 < bVar14) {
        local_58._11_3_ = 0;
        uVar15 = uVar7;
        uVar12 = scale;
        if (bVar1 != 0x2c) goto LAB_0166cc49;
        uVar16 = uVar7 + 1;
        uVar8 = uVar16;
        if (uVar13 <= uVar16) goto LAB_0166cd12;
        local_5c = 0;
        local_58.round_set = false;
        local_58.decimal_count = 0;
        uVar3 = uVar16;
        uVar15 = uVar16;
        goto LAB_0166ca1f;
      }
      if (bVar14 == 0 && local_58.result == 0) {
        local_58.result = 0;
      }
      else {
        if ((uint)width - (uint)scale == (uint)local_58.digit_count) {
          return false;
        }
        if (local_58.result < -0xccccccccccccccc) {
          return false;
        }
        local_58.digit_count = local_58.digit_count + 1;
        local_58.result = local_58.result * 10 - (ulong)bVar14;
      }
      uVar8 = uVar13;
      if (~uVar7 + string_size == uVar9) break;
      if (string_ptr[uVar9 + 1 + uVar7] == '_') {
        if ((string_size - uVar7) - 2 == uVar9) {
          return false;
        }
        uVar7 = uVar7 + 2;
        if (9 < (byte)(string_ptr[uVar9 + uVar7] - 0x30U)) {
          return false;
        }
      }
      else {
        uVar7 = uVar7 + 1;
      }
      uVar8 = uVar7;
    } while (uVar7 < uVar13);
    local_58._11_3_ = 0;
    goto LAB_0166cacf;
  }
  if (bVar1 == 0x30 && string_size - 1 != uVar9) {
    bVar14 = string_ptr[uVar9 + 1];
    if (bVar14 < 0x62) {
      if ((bVar14 != 0x42) && (bVar14 != 0x58)) goto LAB_0166c8f9;
    }
    else if ((bVar14 != 0x62) && (bVar14 != 0x78)) goto LAB_0166c8f9;
    if ((string_size - uVar9) - 3 < 0xfffffffffffffffe) {
      return false;
    }
LAB_0166c9c6:
    DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,false>(&local_58);
    return false;
  }
LAB_0166c8f9:
  uVar7 = string_size - uVar9;
  uVar13 = (ulong)(bVar1 == 0x2b);
  if (uVar7 <= uVar13) goto LAB_0166c9c6;
  local_58.digit_count = 0;
  local_58.result = 0;
  uVar15 = uVar13;
  do {
    bVar1 = string_ptr[uVar9 + uVar15];
    bVar14 = bVar1 - 0x30;
    if (9 < bVar14) {
      local_58._11_3_ = 0;
      uVar16 = uVar15;
      uVar12 = scale;
      if (bVar1 != 0x2c) goto LAB_0166cd60;
      uVar8 = uVar15 + 1;
      uVar3 = uVar8;
      if (uVar7 <= uVar8) goto LAB_0166ce24;
      local_40 = local_40 & 0xffffffff00000000;
      local_5c = 0;
      local_58.decimal_count = 0;
      uVar4 = uVar8;
      uVar16 = uVar8;
      goto LAB_0166cb37;
    }
    if (bVar14 == 0 && local_58.result == 0) {
      local_58.result = 0;
    }
    else {
      if ((uint)width - (uint)scale == (uint)local_58.digit_count) {
        return false;
      }
      if (0xccccccccccccccc < local_58.result) {
        return false;
      }
      local_58.digit_count = local_58.digit_count + 1;
      local_58.result = (ulong)bVar14 + local_58.result * 10;
    }
    uVar3 = uVar7;
    if (~uVar15 + string_size == uVar9) break;
    if (string_ptr[uVar9 + 1 + uVar15] == '_') {
      if ((string_size - uVar15) - 2 == uVar9) {
        return false;
      }
      uVar15 = uVar15 + 2;
      if (9 < (byte)(string_ptr[uVar9 + uVar15] - 0x30U)) {
        return false;
      }
    }
    else {
      uVar15 = uVar15 + 1;
    }
    uVar3 = uVar15;
  } while (uVar15 < uVar7);
  local_58._11_3_ = 0;
  goto LAB_0166cbe9;
LAB_0166ca1f:
  bVar1 = string_ptr[uVar9 + uVar15];
  bVar14 = bVar1 - 0x30;
  local_40 = uVar16;
  if (9 < bVar14) {
    local_58.should_round = (bool)(char)local_5c;
    uVar12 = uVar16 < uVar15 || 1 < uVar7;
    if (uVar16 >= uVar15 && 1 >= uVar7) {
      return false;
    }
LAB_0166cc49:
    uVar6 = (uint)bVar1;
    if (bVar1 < 0x20) {
      if (4 < uVar6 - 9) {
        return false;
      }
LAB_0166cc5f:
      uVar15 = uVar15 + 1;
      uVar8 = uVar15;
      if (uVar15 < uVar13) {
        do {
          if ((4 < (byte)string_ptr[uVar9 + uVar15] - 9) && (string_ptr[uVar9 + uVar15] != 0x20)) {
            return false;
          }
          uVar15 = uVar15 + 1;
          uVar8 = uVar13;
        } while (uVar13 != uVar15);
      }
      goto LAB_0166cacf;
    }
    if ((bVar1 != 0x65) && (uVar6 != 0x45)) {
      if (uVar6 != 0x20) {
        return false;
      }
      goto LAB_0166cc5f;
    }
    if (uVar15 == 1) {
      return false;
    }
    if (uVar13 <= uVar15 + 1) {
      return false;
    }
    local_5e = 0;
    pdVar11 = (duckdb *)(string_ptr + uVar9 + uVar15 + 1);
    pcVar10 = (char *)(~uVar9 + (string_size - uVar15));
    if (*pdVar11 == (duckdb)0x2d) {
      bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                        (pdVar11,pcVar10,(idx_t)&local_5e,(IntegerCastData<short> *)(ulong)bVar1,
                         (bool)uVar12);
    }
    else {
      bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                        (pdVar11,pcVar10,(idx_t)&local_5e,(IntegerCastData<short> *)(ulong)bVar1,
                         (bool)uVar12);
    }
    if (bVar2 == false) {
      return false;
    }
    bVar2 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<long>,true>
                      (&local_58,(int)local_5e);
    goto LAB_0166ce7f;
  }
  if ((local_58.decimal_count == scale) && (!local_58.round_set)) {
    local_5c = (undefined4)CONCAT71((int7)(uVar3 >> 8),4 < bVar14);
    local_58.round_set = true;
  }
  if ((uint)local_58.decimal_count + (uint)local_58.digit_count < 0x12) {
    local_58.decimal_count = local_58.decimal_count + 1;
    local_58.result = local_58.result * 10 - (ulong)bVar14;
  }
  uVar3 = ~uVar15 + string_size;
  uVar8 = uVar13;
  if (uVar3 != uVar9) goto code_r0x0166ca7d;
  goto LAB_0166ccf6;
code_r0x0166ca7d:
  if (string_ptr[uVar9 + 1 + uVar15] == '_') {
    if ((string_size - uVar15) - 2 == uVar9) {
      return false;
    }
    uVar15 = uVar15 + 2;
    bVar1 = (string_ptr + uVar15)[uVar9] - 0x30;
    uVar3 = CONCAT71((int7)((ulong)(string_ptr + uVar15) >> 8),bVar1);
    if (9 < bVar1) {
      return false;
    }
  }
  else {
    uVar15 = uVar15 + 1;
  }
  uVar8 = uVar15;
  if (uVar13 <= uVar15) goto LAB_0166ccf6;
  goto LAB_0166ca1f;
LAB_0166ccf6:
  local_58.should_round = (bool)(char)local_5c;
LAB_0166cd12:
  if ((uVar7 < 2) && (uVar8 <= uVar16)) {
    return false;
  }
LAB_0166cacf:
  bVar2 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,true>(&local_58);
  if (!bVar2) {
    return false;
  }
  if (uVar8 < 2) {
    return false;
  }
  goto LAB_0166cc08;
LAB_0166cb37:
  bVar1 = string_ptr[uVar9 + uVar16];
  uVar5 = (undefined7)(uVar4 >> 8);
  bVar14 = bVar1 - 0x30;
  local_38 = uVar8;
  if (9 < bVar14) {
    local_58.round_set = local_5c._0_1_;
    local_58.should_round = (bool)(char)local_40;
    uVar12 = uVar8 < uVar16 || uVar13 < uVar15;
    if (uVar8 >= uVar16 && uVar13 >= uVar15) {
      return false;
    }
LAB_0166cd60:
    uVar6 = (uint)bVar1;
    if (bVar1 < 0x20) {
      if (4 < uVar6 - 9) {
        return false;
      }
    }
    else {
      if ((bVar1 == 0x65) || (uVar6 == 0x45)) {
        if (uVar16 == uVar13) {
          return false;
        }
        if (uVar7 <= uVar16 + 1) {
          return false;
        }
        local_5e = 0;
        pdVar11 = (duckdb *)(string_ptr + uVar9 + uVar16 + 1);
        pcVar10 = (char *)(~uVar9 + (string_size - uVar16));
        if (*pdVar11 == (duckdb)0x2d) {
          bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                            (pdVar11,pcVar10,(idx_t)&local_5e,(IntegerCastData<short> *)(ulong)bVar1
                             ,(bool)uVar12);
        }
        else {
          bVar2 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                            (pdVar11,pcVar10,(idx_t)&local_5e,(IntegerCastData<short> *)(ulong)bVar1
                             ,(bool)uVar12);
        }
        if (bVar2 == false) {
          return false;
        }
        bVar2 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<long>,false>
                          (&local_58,(int)local_5e);
LAB_0166ce7f:
        if (bVar2 == false) {
          return false;
        }
        goto LAB_0166cc08;
      }
      if (uVar6 != 0x20) {
        return false;
      }
    }
    uVar16 = uVar16 + 1;
    uVar3 = uVar16;
    if (uVar16 < uVar7) {
      do {
        if ((4 < (byte)string_ptr[uVar9 + uVar16] - 9) && (string_ptr[uVar9 + uVar16] != 0x20)) {
          return false;
        }
        uVar16 = uVar16 + 1;
        uVar3 = uVar7;
      } while (uVar7 != uVar16);
    }
    goto LAB_0166cbe9;
  }
  if ((local_58.decimal_count == scale) && (local_5c._0_1_ == false)) {
    local_40 = CONCAT44(local_40._4_4_,(int)CONCAT71(uVar5,4 < bVar14));
    local_5c = (undefined4)CONCAT71(uVar5,1);
  }
  if ((uint)local_58.decimal_count + (uint)local_58.digit_count < 0x12) {
    local_58.decimal_count = local_58.decimal_count + 1;
    local_58.result = (ulong)bVar14 + local_58.result * 10;
  }
  uVar4 = ~uVar16 + string_size;
  uVar3 = uVar7;
  if (uVar4 != uVar9) goto code_r0x0166cb97;
  goto LAB_0166ce05;
code_r0x0166cb97:
  if (string_ptr[uVar9 + 1 + uVar16] == '_') {
    if ((string_size - uVar16) - 2 == uVar9) {
      return false;
    }
    uVar16 = uVar16 + 2;
    bVar1 = (string_ptr + uVar16)[uVar9] - 0x30;
    uVar4 = CONCAT71((int7)((ulong)(string_ptr + uVar16) >> 8),bVar1);
    if (9 < bVar1) {
      return false;
    }
  }
  else {
    uVar16 = uVar16 + 1;
  }
  uVar3 = uVar16;
  if (uVar7 <= uVar16) goto LAB_0166ce05;
  goto LAB_0166cb37;
LAB_0166ce05:
  local_58.round_set = SUB41(local_5c,0);
  local_58.should_round = (bool)(char)local_40;
LAB_0166ce24:
  if ((uVar15 <= uVar13) && (uVar3 <= uVar8)) {
    return false;
  }
LAB_0166cbe9:
  bVar2 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<long>,false>(&local_58);
  if (!bVar2) {
    return false;
  }
  if (uVar3 <= uVar13) {
    return false;
  }
LAB_0166cc08:
  *result = local_58.result;
  return true;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		return false;
	}
	result = state.result;
	return true;
}